

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  int iVar1;
  ImGuiTable *pIVar2;
  long in_RDI;
  int i;
  ImGuiContext *g;
  ImPoolIdx in_stack_ffffffffffffffdc;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  while( true ) {
    iVar4 = iVar3;
    iVar1 = ImPool<ImGuiTable>::GetSize((ImPool<ImGuiTable> *)(in_RDI + 0x20a8));
    if (iVar3 == iVar1) break;
    pIVar2 = ImPool<ImGuiTable>::GetByIndex
                       ((ImPool<ImGuiTable> *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffdc);
    pIVar2->SettingsOffset = -1;
    iVar3 = iVar4 + 1;
  }
  ImChunkStream<ImGuiTableSettings>::clear((ImChunkStream<ImGuiTableSettings> *)0x2d9fdd);
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
        g.Tables.GetByIndex(i)->SettingsOffset = -1;
    g.SettingsTables.clear();
}